

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsFoodWeb_ASAi_kry.c
# Opt level: O0

void GSIter(sunrealtype gamma,N_Vector z,N_Vector x,WebData wdata)

{
  long lVar1;
  long lVar2;
  long in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  double in_XMM0_Qa;
  double dVar3;
  sunrealtype *zd;
  sunrealtype *xd;
  sunrealtype *coy;
  sunrealtype *cox;
  sunrealtype temp;
  sunrealtype gam2 [6];
  sunrealtype gam [6];
  sunrealtype cof1 [6];
  sunrealtype beta2 [6];
  sunrealtype beta [6];
  int y_loc;
  int x_loc;
  int my;
  int mx;
  int mxns;
  int ns;
  int jy;
  int jx;
  int iyoff;
  int iter;
  int ic;
  int i;
  int local_188;
  int local_184;
  int local_178;
  int local_174;
  sunrealtype local_148 [6];
  sunrealtype local_118 [6];
  sunrealtype local_e8 [6];
  sunrealtype local_b8 [6];
  sunrealtype local_88 [7];
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  long local_20;
  undefined8 local_18;
  undefined8 local_10;
  double local_8;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_8 = in_XMM0_Qa;
  lVar1 = N_VGetArrayPointer(in_RSI);
  lVar2 = N_VGetArrayPointer(local_10);
  local_3c = *(int *)(local_20 + 0x40);
  local_44 = *(int *)(local_20 + 0x50);
  local_48 = *(int *)(local_20 + 0x54);
  local_40 = *(int *)(local_20 + 0x44);
  for (local_24 = 0; local_24 < local_3c; local_24 = local_24 + 1) {
    dVar3 = 1.0 / (local_8 * 2.0 *
                   (*(double *)(local_20 + 0x2b0 + (long)local_24 * 8) +
                   *(double *)(local_20 + 0x2e0 + (long)local_24 * 8)) + 1.0);
    local_88[local_24] = local_8 * *(double *)(local_20 + 0x2b0 + (long)local_24 * 8) * dVar3;
    local_b8[local_24] = local_88[local_24] * 2.0;
    local_118[local_24] = local_8 * *(double *)(local_20 + 0x2e0 + (long)local_24 * 8) * dVar3;
    local_148[local_24] = local_118[local_24] * 2.0;
    local_e8[local_24] = dVar3;
  }
  for (local_38 = 0; local_38 < local_48; local_38 = local_38 + 1) {
    local_30 = local_40 * local_38;
    for (local_34 = 0; local_34 < local_44; local_34 = local_34 + 1) {
      local_28 = local_30 + local_3c * local_34;
      v_prod((sunrealtype *)(lVar1 + (long)local_28 * 8),local_e8,
             (sunrealtype *)(lVar2 + (long)local_28 * 8),local_3c);
    }
  }
  N_VConst(0,local_10);
  for (local_2c = 1; local_2c < 6; local_2c = local_2c + 1) {
    if (1 < local_2c) {
      for (local_38 = 0; local_38 < local_48; local_38 = local_38 + 1) {
        local_30 = local_40 * local_38;
        for (local_34 = 0; local_34 < local_44; local_34 = local_34 + 1) {
          local_28 = local_30 + local_3c * local_34;
          if (local_34 == 0) {
            local_174 = 0;
          }
          else {
            local_174 = 1;
            if (local_34 == local_44 + -1) {
              local_174 = 2;
            }
          }
          local_4c = local_174;
          if (local_38 == 0) {
            local_178 = 0;
          }
          else {
            local_178 = 1;
            if (local_38 == local_48 + -1) {
              local_178 = 2;
            }
          }
          local_50 = local_178;
          switch(local_178 * 3 + local_174) {
          case 0:
            v_sum_prods((sunrealtype *)(lVar1 + (long)local_28 * 8),local_b8,
                        (sunrealtype *)(lVar1 + (long)local_28 * 8 + (long)local_3c * 8),local_148,
                        (sunrealtype *)(lVar1 + (long)local_28 * 8 + (long)local_40 * 8),local_3c);
            break;
          case 1:
            v_sum_prods((sunrealtype *)(lVar1 + (long)local_28 * 8),local_88,
                        (sunrealtype *)(lVar1 + (long)local_28 * 8 + (long)local_3c * 8),local_148,
                        (sunrealtype *)(lVar1 + (long)local_28 * 8 + (long)local_40 * 8),local_3c);
            break;
          case 2:
            v_prod((sunrealtype *)(lVar1 + (long)local_28 * 8),local_148,
                   (sunrealtype *)(lVar1 + (long)local_28 * 8 + (long)local_40 * 8),local_3c);
            break;
          case 3:
            v_sum_prods((sunrealtype *)(lVar1 + (long)local_28 * 8),local_b8,
                        (sunrealtype *)(lVar1 + (long)local_28 * 8 + (long)local_3c * 8),local_118,
                        (sunrealtype *)(lVar1 + (long)local_28 * 8 + (long)local_40 * 8),local_3c);
            break;
          case 4:
            v_sum_prods((sunrealtype *)(lVar1 + (long)local_28 * 8),local_88,
                        (sunrealtype *)(lVar1 + (long)local_28 * 8 + (long)local_3c * 8),local_118,
                        (sunrealtype *)(lVar1 + (long)local_28 * 8 + (long)local_40 * 8),local_3c);
            break;
          case 5:
            v_prod((sunrealtype *)(lVar1 + (long)local_28 * 8),local_118,
                   (sunrealtype *)(lVar1 + (long)local_28 * 8 + (long)local_40 * 8),local_3c);
            break;
          case 6:
            v_prod((sunrealtype *)(lVar1 + (long)local_28 * 8),local_b8,
                   (sunrealtype *)(lVar1 + (long)local_28 * 8 + (long)local_3c * 8),local_3c);
            break;
          case 7:
            v_prod((sunrealtype *)(lVar1 + (long)local_28 * 8),local_88,
                   (sunrealtype *)(lVar1 + (long)local_28 * 8 + (long)local_3c * 8),local_3c);
            break;
          case 8:
            v_zero((sunrealtype *)(lVar1 + (long)local_28 * 8),local_3c);
          }
        }
      }
    }
    for (local_38 = 0; local_38 < local_48; local_38 = local_38 + 1) {
      local_30 = local_40 * local_38;
      for (local_34 = 0; local_34 < local_44; local_34 = local_34 + 1) {
        local_28 = local_30 + local_3c * local_34;
        if (local_34 == 0) {
          local_184 = 0;
        }
        else {
          local_184 = 1;
          if (local_34 == local_44 + -1) {
            local_184 = 2;
          }
        }
        local_4c = local_184;
        if (local_38 == 0) {
          local_188 = 0;
        }
        else {
          local_188 = 1;
          if (local_38 == local_48 + -1) {
            local_188 = 2;
          }
        }
        local_50 = local_188;
        switch(local_188 * 3 + local_184) {
        case 0:
          break;
        case 1:
          v_inc_by_prod((sunrealtype *)(lVar1 + (long)local_28 * 8),local_88,
                        (sunrealtype *)(lVar1 + (long)local_28 * 8 + (long)local_3c * -8),local_3c);
          break;
        case 2:
          v_inc_by_prod((sunrealtype *)(lVar1 + (long)local_28 * 8),local_b8,
                        (sunrealtype *)(lVar1 + (long)local_28 * 8 + (long)local_3c * -8),local_3c);
          break;
        case 3:
          v_inc_by_prod((sunrealtype *)(lVar1 + (long)local_28 * 8),local_118,
                        (sunrealtype *)(lVar1 + (long)local_28 * 8 + (long)local_40 * -8),local_3c);
          break;
        case 4:
          v_inc_by_prod((sunrealtype *)(lVar1 + (long)local_28 * 8),local_88,
                        (sunrealtype *)(lVar1 + (long)local_28 * 8 + (long)local_3c * -8),local_3c);
          v_inc_by_prod((sunrealtype *)(lVar1 + (long)local_28 * 8),local_118,
                        (sunrealtype *)(lVar1 + (long)local_28 * 8 + (long)local_40 * -8),local_3c);
          break;
        case 5:
          v_inc_by_prod((sunrealtype *)(lVar1 + (long)local_28 * 8),local_b8,
                        (sunrealtype *)(lVar1 + (long)local_28 * 8 + (long)local_3c * -8),local_3c);
          v_inc_by_prod((sunrealtype *)(lVar1 + (long)local_28 * 8),local_118,
                        (sunrealtype *)(lVar1 + (long)local_28 * 8 + (long)local_40 * -8),local_3c);
          break;
        case 6:
          v_inc_by_prod((sunrealtype *)(lVar1 + (long)local_28 * 8),local_148,
                        (sunrealtype *)(lVar1 + (long)local_28 * 8 + (long)local_40 * -8),local_3c);
          break;
        case 7:
          v_inc_by_prod((sunrealtype *)(lVar1 + (long)local_28 * 8),local_88,
                        (sunrealtype *)(lVar1 + (long)local_28 * 8 + (long)local_3c * -8),local_3c);
          v_inc_by_prod((sunrealtype *)(lVar1 + (long)local_28 * 8),local_148,
                        (sunrealtype *)(lVar1 + (long)local_28 * 8 + (long)local_40 * -8),local_3c);
          break;
        case 8:
          v_inc_by_prod((sunrealtype *)(lVar1 + (long)local_28 * 8),local_b8,
                        (sunrealtype *)(lVar1 + (long)local_28 * 8 + (long)local_3c * -8),local_3c);
          v_inc_by_prod((sunrealtype *)(lVar1 + (long)local_28 * 8),local_148,
                        (sunrealtype *)(lVar1 + (long)local_28 * 8 + (long)local_40 * -8),local_3c);
        }
      }
    }
    N_VLinearSum(0x3ff0000000000000,local_10,local_18,local_10);
  }
  return;
}

Assistant:

static void GSIter(sunrealtype gamma, N_Vector z, N_Vector x, WebData wdata)
{
  int i, ic, iter, iyoff, jx, jy, ns, mxns, mx, my, x_loc, y_loc;
  sunrealtype beta[NS], beta2[NS], cof1[NS], gam[NS], gam2[NS];
  sunrealtype temp, *cox, *coy, *xd, *zd;

  xd   = N_VGetArrayPointer(x);
  zd   = N_VGetArrayPointer(z);
  ns   = wdata->ns;
  mx   = wdata->mx;
  my   = wdata->my;
  mxns = wdata->mxns;
  cox  = wdata->cox;
  coy  = wdata->coy;

  /* Write matrix as P = D - L - U.
     Load local arrays beta, beta2, gam, gam2, and cof1. */

  for (i = 0; i < ns; i++)
  {
    temp     = ONE / (ONE + TWO * gamma * (cox[i] + coy[i]));
    beta[i]  = gamma * cox[i] * temp;
    beta2[i] = TWO * beta[i];
    gam[i]   = gamma * coy[i] * temp;
    gam2[i]  = TWO * gam[i];
    cof1[i]  = temp;
  }

  /* Begin iteration loop.
  Load vector x with (D-inverse)*z for first iteration. */

  for (jy = 0; jy < my; jy++)
  {
    iyoff = mxns * jy;
    for (jx = 0; jx < mx; jx++)
    {
      ic = iyoff + ns * jx;
      v_prod(xd + ic, cof1, zd + ic, ns); /* x[ic+i] = cof1[i]z[ic+i] */
    }
  }
  N_VConst(ZERO, z);

  /* Looping point for iterations. */

  for (iter = 1; iter <= ITMAX; iter++)
  {
    /* Calculate (D-inverse)*U*x if not the first iteration. */

    if (iter > 1)
    {
      for (jy = 0; jy < my; jy++)
      {
        iyoff = mxns * jy;
        for (jx = 0; jx < mx; jx++)
        { /* order of loops matters */
          ic    = iyoff + ns * jx;
          x_loc = (jx == 0) ? 0 : ((jx == mx - 1) ? 2 : 1);
          y_loc = (jy == 0) ? 0 : ((jy == my - 1) ? 2 : 1);
          switch (3 * y_loc + x_loc)
          {
          case 0: /* jx == 0, jy == 0 */
            /* x[ic+i] = beta2[i]x[ic+ns+i] + gam2[i]x[ic+mxns+i] */
            v_sum_prods(xd + ic, beta2, xd + ic + ns, gam2, xd + ic + mxns, ns);
            break;
          case 1: /* 1 <= jx <= mx-2, jy == 0 */
            /* x[ic+i] = beta[i]x[ic+ns+i] + gam2[i]x[ic+mxns+i] */
            v_sum_prods(xd + ic, beta, xd + ic + ns, gam2, xd + ic + mxns, ns);
            break;
          case 2: /* jx == mx-1, jy == 0 */
            /* x[ic+i] = gam2[i]x[ic+mxns+i] */
            v_prod(xd + ic, gam2, xd + ic + mxns, ns);
            break;
          case 3: /* jx == 0, 1 <= jy <= my-2 */
            /* x[ic+i] = beta2[i]x[ic+ns+i] + gam[i]x[ic+mxns+i] */
            v_sum_prods(xd + ic, beta2, xd + ic + ns, gam, xd + ic + mxns, ns);
            break;
          case 4: /* 1 <= jx <= mx-2, 1 <= jy <= my-2 */
            /* x[ic+i] = beta[i]x[ic+ns+i] + gam[i]x[ic+mxns+i] */
            v_sum_prods(xd + ic, beta, xd + ic + ns, gam, xd + ic + mxns, ns);
            break;
          case 5: /* jx == mx-1, 1 <= jy <= my-2 */
            /* x[ic+i] = gam[i]x[ic+mxns+i] */
            v_prod(xd + ic, gam, xd + ic + mxns, ns);
            break;
          case 6: /* jx == 0, jy == my-1 */
            /* x[ic+i] = beta2[i]x[ic+ns+i] */
            v_prod(xd + ic, beta2, xd + ic + ns, ns);
            break;
          case 7: /* 1 <= jx <= mx-2, jy == my-1 */
            /* x[ic+i] = beta[i]x[ic+ns+i] */
            v_prod(xd + ic, beta, xd + ic + ns, ns);
            break;
          case 8: /* jx == mx-1, jy == my-1 */
            /* x[ic+i] = ZERO */
            v_zero(xd + ic, ns);
            break;
          }
        }
      }
    } /* end if (iter > 1) */

    /* Overwrite x with [(I - (D-inverse)*L)-inverse]*x. */

    for (jy = 0; jy < my; jy++)
    {
      iyoff = mxns * jy;
      for (jx = 0; jx < mx; jx++)
      { /* order of loops matters */
        ic    = iyoff + ns * jx;
        x_loc = (jx == 0) ? 0 : ((jx == mx - 1) ? 2 : 1);
        y_loc = (jy == 0) ? 0 : ((jy == my - 1) ? 2 : 1);
        switch (3 * y_loc + x_loc)
        {
        case 0: /* jx == 0, jy == 0 */ break;
        case 1: /* 1 <= jx <= mx-2, jy == 0 */
          /* x[ic+i] += beta[i]x[ic-ns+i] */
          v_inc_by_prod(xd + ic, beta, xd + ic - ns, ns);
          break;
        case 2: /* jx == mx-1, jy == 0 */
          /* x[ic+i] += beta2[i]x[ic-ns+i] */
          v_inc_by_prod(xd + ic, beta2, xd + ic - ns, ns);
          break;
        case 3: /* jx == 0, 1 <= jy <= my-2 */
          /* x[ic+i] += gam[i]x[ic-mxns+i] */
          v_inc_by_prod(xd + ic, gam, xd + ic - mxns, ns);
          break;
        case 4: /* 1 <= jx <= mx-2, 1 <= jy <= my-2 */
          /* x[ic+i] += beta[i]x[ic-ns+i] + gam[i]x[ic-mxns+i] */
          v_inc_by_prod(xd + ic, beta, xd + ic - ns, ns);
          v_inc_by_prod(xd + ic, gam, xd + ic - mxns, ns);
          break;
        case 5: /* jx == mx-1, 1 <= jy <= my-2 */
          /* x[ic+i] += beta2[i]x[ic-ns+i] + gam[i]x[ic-mxns+i] */
          v_inc_by_prod(xd + ic, beta2, xd + ic - ns, ns);
          v_inc_by_prod(xd + ic, gam, xd + ic - mxns, ns);
          break;
        case 6: /* jx == 0, jy == my-1 */
          /* x[ic+i] += gam2[i]x[ic-mxns+i] */
          v_inc_by_prod(xd + ic, gam2, xd + ic - mxns, ns);
          break;
        case 7: /* 1 <= jx <= mx-2, jy == my-1 */
          /* x[ic+i] += beta[i]x[ic-ns+i] + gam2[i]x[ic-mxns+i] */
          v_inc_by_prod(xd + ic, beta, xd + ic - ns, ns);
          v_inc_by_prod(xd + ic, gam2, xd + ic - mxns, ns);
          break;
        case 8: /* jx == mx-1, jy == my-1 */
          /* x[ic+i] += beta2[i]x[ic-ns+i] + gam2[i]x[ic-mxns+i] */
          v_inc_by_prod(xd + ic, beta2, xd + ic - ns, ns);
          v_inc_by_prod(xd + ic, gam2, xd + ic - mxns, ns);
          break;
        }
      }
    }

    /* Add increment x to z : z <- z+x */

    N_VLinearSum(ONE, z, ONE, x, z);
  }
}